

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_strategy ZVar1;
  U32 UVar2;
  void *pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  ZSTD_compressionParameters cPar;
  U32 UVar17;
  U32 end;
  int iVar18;
  uint uVar19;
  ZSTD_TraceCtx ZVar20;
  size_t sVar21;
  ulong uVar22;
  size_t sVar23;
  byte bVar24;
  uint uVar25;
  ZSTD_matchState_t *srcMatchState;
  size_t sVar26;
  ZSTD_matchState_t *dstMatchState;
  undefined4 uVar27;
  undefined4 uVar28;
  uint uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  ZSTD_strategy ZStack_100;
  ZSTD_CCtx_params local_e0;
  
  sVar21 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar21 = cdict->dictContentSize;
  }
  ZVar20 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar20;
  if ((((cdict == (ZSTD_CDict *)0x0) || (sVar23 = cdict->dictContentSize, sVar23 == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff &&
         (sVar23 * 6 < pledgedSrcSize || sVar23 * 6 - pledgedSrcSize == 0)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar23 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar21,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar23) {
      return sVar23;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar27 = SUB84(cctx->entropyWorkspace,0);
      uVar28 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      uVar27 = SUB84(cctx->entropyWorkspace,0);
      uVar28 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
    }
    sVar23 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        (void *)CONCAT44(uVar28,uVar27));
    if (0xffffffffffffff88 < sVar23) {
      return sVar23;
    }
    cctx->dictID = (U32)sVar23;
    cctx->dictContentSize = sVar21;
  }
  else {
    iVar18 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
    if (iVar18 == 0) {
      memcpy(&local_e0,params,0xb0);
      uVar11 = (cdict->matchState).cParams.chainLog;
      uVar12 = (cdict->matchState).cParams.hashLog;
      uVar13 = (cdict->matchState).cParams.searchLog;
      uVar14 = (cdict->matchState).cParams.minMatch;
      local_e0.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      local_e0.cParams.strategy = (cdict->matchState).cParams.strategy;
      local_e0.cParams.chainLog = uVar11;
      local_e0.useRowMatchFinder = cdict->useRowMatchFinder;
      local_e0.cParams.hashLog = uVar12;
      local_e0.cParams.searchLog = uVar13;
      local_e0.cParams.minMatch = uVar14;
      sVar21 = ZSTD_resetCCtx_internal(cctx,&local_e0,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
      if (0xffffffffffffff88 < sVar21) {
        return sVar21;
      }
      (cctx->workspace).tableValidEnd = (cctx->workspace).objectEnd;
      ZVar1 = (cdict->matchState).cParams.strategy;
      if ((ZVar1 == ZSTD_fast) ||
         ((ZVar1 - ZSTD_greedy < 3 && (cdict->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder))))
      {
        sVar26 = 0;
      }
      else {
        sVar26 = 4L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      bVar24 = (byte)(cdict->matchState).cParams.hashLog;
      memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
             4L << (bVar24 & 0x3f));
      ZVar1 = (cctx->appliedParams).cParams.strategy;
      if ((ZVar1 != ZSTD_fast) &&
         ((2 < ZVar1 - ZSTD_greedy ||
          ((cctx->appliedParams).useRowMatchFinder != ZSTD_urm_enableRowMatchFinder)))) {
        memcpy((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar26);
      }
      if ((0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2) &&
         (cdict->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder)) {
        memcpy((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,
               2L << (bVar24 & 0x3f));
      }
      UVar2 = (cctx->blockState).matchState.hashLog3;
      sVar26 = 0;
      if (UVar2 != 0) {
        sVar26 = 4L << ((byte)UVar2 & 0x3f);
      }
      memset((cctx->blockState).matchState.hashTable3,0,sVar26);
      pvVar3 = (cctx->workspace).tableEnd;
      if ((cctx->workspace).tableValidEnd < pvVar3) {
        (cctx->workspace).tableValidEnd = pvVar3;
      }
      uVar27 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
      (cctx->blockState).matchState.window.nbOverflowCorrections =
           (cdict->matchState).window.nbOverflowCorrections;
      *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar27;
      pBVar15 = (cdict->matchState).window.nextSrc;
      pBVar16 = (cdict->matchState).window.base;
      UVar2 = (cdict->matchState).window.dictLimit;
      UVar17 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
      (cctx->blockState).matchState.window.dictLimit = UVar2;
      (cctx->blockState).matchState.window.lowLimit = UVar17;
      (cctx->blockState).matchState.window.nextSrc = pBVar15;
      (cctx->blockState).matchState.window.base = pBVar16;
      UVar2 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar2;
    }
    else {
      memcpy(&local_e0,params,0xb0);
      uVar4 = (cdict->matchState).cParams.windowLog;
      uVar5 = (cdict->matchState).cParams.chainLog;
      cPar.chainLog = uVar5;
      cPar.windowLog = uVar4;
      uVar6 = (cdict->matchState).cParams.hashLog;
      uVar7 = (cdict->matchState).cParams.searchLog;
      uVar8 = (cdict->matchState).cParams.minMatch;
      uVar9 = (cdict->matchState).cParams.targetLength;
      uVar10 = (cdict->matchState).cParams.strategy;
      uVar19 = local_e0.cParams.windowLog;
      uStack_110 = uVar6;
      if (((cdict->matchState).dedicatedDictSearch != 0) &&
         (uStack_110 = uVar6, uVar10 - ZSTD_greedy < 3)) {
        uStack_110 = 6;
        if (6 < uVar6 - 2) {
          uStack_110 = uVar6 - 2;
        }
      }
      cPar.hashLog = uStack_110;
      cPar.searchLog = uVar7;
      cPar.minMatch = uVar8;
      cPar.targetLength = uVar9;
      cPar.strategy = uVar10;
      ZSTD_adjustCParams_internal(&local_e0.cParams,cPar,pledgedSrcSize,sVar23,ZSTD_cpm_attachDict);
      local_e0.cParams._0_8_ = CONCAT44(local_e0.cParams.chainLog,uVar19);
      local_e0.useRowMatchFinder = cdict->useRowMatchFinder;
      sVar21 = ZSTD_resetCCtx_internal(cctx,&local_e0,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
      if (0xffffffffffffff88 < sVar21) {
        return sVar21;
      }
      uVar22 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
      uVar19 = (uint)uVar22;
      if ((cdict->matchState).window.dictLimit != uVar19) {
        (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
        uVar25 = (cctx->blockState).matchState.window.dictLimit;
        if (uVar25 < uVar19) {
          (cctx->blockState).matchState.window.nextSrc =
               (cctx->blockState).matchState.window.base + (uVar22 & 0xffffffff);
          (cctx->blockState).matchState.window.lowLimit = uVar19;
          (cctx->blockState).matchState.window.dictLimit = uVar19;
          uVar25 = uVar19;
        }
        (cctx->blockState).matchState.loadedDictEnd = uVar25;
      }
    }
    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;
    memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}